

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::texcoord3h> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::texcoord3h>
          (optional<tinyusdz::value::texcoord3h> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::texcoord3h> local_20;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::value::texcoord3h>(&local_20,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_20.has_value_;
    if (local_20.has_value_ != true) {
      return __return_storage_ptr__;
    }
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = local_20.contained._4_2_;
    *(undefined4 *)&__return_storage_ptr__->contained = local_20.contained._0_4_;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined4 *)&__return_storage_ptr__->contained = 0;
  *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }